

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall
QObjectPrivate::setThreadData_helper
          (QObjectPrivate *this,QThreadData *currentData,QThreadData *targetData,
          QBindingStatus *status)

{
  bool bVar1;
  QBindingStatus *status_00;
  qsizetype qVar2;
  const_reference pQVar3;
  Type pQVar4;
  Type pCVar5;
  Type pQVar6;
  Type pQVar7;
  long i_00;
  QThreadData *in_RCX;
  QThreadData *in_RDX;
  QObjectPrivate *in_RSI;
  QObjectPrivate *in_RDI;
  QObject *child;
  int i_1;
  QThreadData *old;
  QObject *r;
  Connection *c;
  ConnectionData *cd;
  QPostEvent *pe;
  qsizetype i;
  qsizetype eventsMoved;
  QObject *q;
  Type in_stack_ffffffffffffff78;
  QThreadData *this_00;
  int local_64;
  QPostEvent *in_stack_ffffffffffffffa0;
  QPostEventList *in_stack_ffffffffffffffa8;
  Connection *local_50;
  QThreadData *local_38;
  long local_30;
  
  status_00 = (QBindingStatus *)q_func(in_RDI);
  if (in_RCX != (QThreadData *)0x0) {
    (in_RDI->super_QObjectData).bindingStorage.bindingStatus = (QBindingStatus *)in_RCX;
  }
  local_30 = 0;
  local_38 = (QThreadData *)0x0;
  while (this_00 = local_38,
        qVar2 = QList<QPostEvent>::size((QList<QPostEvent> *)&(in_RSI->super_QObjectData).children),
        (long)this_00 < qVar2) {
    pQVar3 = QList<QPostEvent>::at
                       ((QList<QPostEvent> *)this_00,(qsizetype)in_stack_ffffffffffffff78);
    if ((pQVar3->event != (QEvent *)0x0) && ((QBindingStatus *)pQVar3->receiver == status_00)) {
      QPostEventList::addEvent(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      pQVar3->event = (QEvent *)0x0;
      local_30 = local_30 + 1;
    }
    local_38 = (QThreadData *)((long)&((DataPointer *)&local_38->eventLoops)->d + 1);
  }
  if ((0 < local_30) && (bVar1 = QThreadData::hasEventDispatcher((QThreadData *)0x3ee4c3), bVar1)) {
    in_RDX->canWait = false;
    pQVar4 = QBasicAtomicPointer<QAbstractEventDispatcher>::loadRelaxed
                       ((QBasicAtomicPointer<QAbstractEventDispatcher> *)0x3ee4e3);
    (*(pQVar4->super_QObject)._vptr_QObject[0x14])();
  }
  pCVar5 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
                     ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3ee4fd);
  if (pCVar5 != (Type)0x0) {
    if (pCVar5->currentSender != (Sender *)0x0) {
      Sender::receiverDeleted(pCVar5->currentSender);
      pCVar5->currentSender = (Sender *)0x0;
    }
    if (pCVar5 != (Type)0x0) {
      for (local_50 = pCVar5->senders; local_50 != (Connection *)0x0;
          local_50 = (local_50->super_ConnectionOrSignalVector).field_0.next) {
        pQVar6 = QBasicAtomicPointer<QObject>::loadRelaxed((QBasicAtomicPointer<QObject> *)0x3ee565)
        ;
        if (pQVar6 != (Type)0x0) {
          QThreadData::ref((QThreadData *)0x3ee57c);
          pQVar7 = QBasicAtomicPointer<QThreadData>::loadRelaxed
                             ((QBasicAtomicPointer<QThreadData> *)0x3ee58a);
          if (pQVar7 != (Type)0x0) {
            QThreadData::deref(this_00);
          }
          QBasicAtomicPointer<QThreadData>::storeRelaxed
                    ((QBasicAtomicPointer<QThreadData> *)this_00,in_stack_ffffffffffffff78);
        }
      }
    }
  }
  QThreadData::ref((QThreadData *)0x3ee5d1);
  QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x3ee5df);
  QThreadData::deref(this_00);
  QBasicAtomicPointer<QThreadData>::storeRelease
            ((QBasicAtomicPointer<QThreadData> *)this_00,in_stack_ffffffffffffff78);
  local_64 = 0;
  while( true ) {
    i_00 = (long)local_64;
    qVar2 = QList<QObject_*>::size(&(in_RDI->super_QObjectData).children);
    if (qVar2 <= i_00) break;
    QList<QObject_*>::at((QList<QObject_*> *)this_00,i_00);
    QObject::d_func((QObject *)0x3ee64a);
    setThreadData_helper(in_RSI,in_RDX,in_RCX,status_00);
    local_64 = local_64 + 1;
  }
  return;
}

Assistant:

void QObjectPrivate::setThreadData_helper(QThreadData *currentData, QThreadData *targetData, QBindingStatus *status)
{
    Q_Q(QObject);

    if (status) {
        // the new thread is already running
        this->bindingStorage.bindingStatus = status;
    }

    // move posted events
    qsizetype eventsMoved = 0;
    for (qsizetype i = 0; i < currentData->postEventList.size(); ++i) {
        const QPostEvent &pe = currentData->postEventList.at(i);
        if (!pe.event)
            continue;
        if (pe.receiver == q) {
            // move this post event to the targetList
            targetData->postEventList.addEvent(pe);
            const_cast<QPostEvent &>(pe).event = nullptr;
            ++eventsMoved;
        }
    }
    if (eventsMoved > 0 && targetData->hasEventDispatcher()) {
        targetData->canWait = false;
        targetData->eventDispatcher.loadRelaxed()->wakeUp();
    }

    // the current emitting thread shouldn't restore currentSender after calling moveToThread()
    ConnectionData *cd = connections.loadAcquire();
    if (cd) {
        if (cd->currentSender) {
            cd->currentSender->receiverDeleted();
            cd->currentSender = nullptr;
        }

        // adjust the receiverThreadId values in the Connections
        if (cd) {
            auto *c = cd->senders;
            while (c) {
                QObject *r = c->receiver.loadRelaxed();
                if (r) {
                    Q_ASSERT(r == q);
                    targetData->ref();
                    QThreadData *old = c->receiverThreadData.loadRelaxed();
                    if (old)
                        old->deref();
                    c->receiverThreadData.storeRelaxed(targetData);
                }
                c = c->next;
            }
        }

    }

    // set new thread data
    targetData->ref();
    threadData.loadRelaxed()->deref();

    // synchronizes with loadAcquire e.g. in QCoreApplication::postEvent
    threadData.storeRelease(targetData);

    for (int i = 0; i < children.size(); ++i) {
        QObject *child = children.at(i);
        child->d_func()->setThreadData_helper(currentData, targetData, status);
    }
}